

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O3

void __thiscall
embree::avx::BVHNBuilderTwoLevel<8,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderSmall::
attachBuildRefs(RefBuilderSmall *this,
               BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  FastAllocator *this_00;
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  atomic<int> *paVar3;
  undefined4 *puVar4;
  long *plVar5;
  int iVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  Geometry *pGVar12;
  BVH *pBVar13;
  ThreadLocal2 *this_01;
  iterator __position;
  Ref<embree::Geometry> *pRVar14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  BuildRef *pBVar17;
  undefined8 *puVar18;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar20;
  undefined1 auVar21 [16];
  undefined4 uVar22;
  undefined8 uVar23;
  ThreadLocal2 *this_02;
  ulong uVar24;
  undefined1 (*pauVar25) [16];
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  float *pfVar29;
  long lVar30;
  size_t sVar31;
  ulong uVar32;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vuint<4> vgeomID;
  Lock<embree::MutexSys> lock;
  Vec3vf<4> v1;
  Vec3vf<4> v2;
  vuint<4> vprimID;
  PrimInfo pinfo;
  undefined1 local_178 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  PrimRef *local_140;
  undefined8 *local_138;
  undefined1 uStack_130;
  undefined7 uStack_12f;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_108;
  char cStack_100;
  undefined7 uStack_ff;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  RefBuilderSmall *local_d8;
  long *local_d0;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  undefined1 local_78 [16];
  long local_48;
  long local_40;
  
  sVar31 = this->objectID_;
  pGVar12 = (topBuilder->scene->geometries).items[sVar31].ptr;
  uVar8 = pGVar12->numPrimitives;
  uVar32 = CONCAT44(0,uVar8);
  lVar27 = *(long *)&(topBuilder->scene->super_AccelN).field_0x188;
  local_160._0_8_ = lVar27 + 0x550;
  if (lVar27 == 0) {
    local_160._0_8_ = (MemoryMonitorInterface *)0x0;
  }
  local_160[8] = false;
  local_150 = (undefined1  [16])0x0;
  local_140 = (PrimRef *)0x0;
  local_d8 = this;
  if (uVar32 != 0) {
    sVar31 = uVar32 << 5;
    (**((MemoryMonitorInterface *)local_160._0_8_)->_vptr_MemoryMonitorInterface)
              (local_160._0_8_,sVar31,0);
    if (uVar8 < 0xe0000) {
      local_140 = (PrimRef *)alignedMalloc(sVar31,0x20);
    }
    else {
      local_140 = (PrimRef *)os_malloc(sVar31,(bool *)(local_160 + 8));
    }
    local_150._8_4_ = uVar8;
    local_150._0_8_ = uVar32;
    local_150._12_4_ = 0;
    sVar31 = local_d8->objectID_;
  }
  avx::createPrimRefArray
            ((PrimInfo *)&local_88.field_1,pGVar12,(uint)sVar31,uVar32,(mvector<PrimRef> *)local_160
             ,&(topBuilder->bvh->scene->progressInterface).super_BuildProgressMonitor);
  if (local_40 != local_48) {
    local_d0 = (long *)__tls_get_addr(&PTR_021a7d38);
    auVar33._8_56_ = extraout_var;
    auVar33._0_8_ = extraout_XMM0_Qa;
    uVar32 = 0;
    do {
      auVar34 = auVar33._0_16_;
      pBVar13 = topBuilder->bvh;
      this_02 = (ThreadLocal2 *)*local_d0;
      if (this_02 == (ThreadLocal2 *)0x0) {
        this_02 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
        MutexSys::MutexSys((MutexSys *)this_02);
        (this_02->alloc)._M_b._M_p = (__pointer_type)0x0;
        (this_02->alloc0).parent = this_02;
        (this_02->alloc0).ptr = (char *)0x0;
        (this_02->alloc0).cur = 0;
        (this_02->alloc0).end = 0;
        (this_02->alloc0).allocBlockSize = 0;
        (this_02->alloc0).end = 0;
        (this_02->alloc0).allocBlockSize = 0;
        (this_02->alloc0).bytesUsed = 0;
        (this_02->alloc0).bytesWasted = 0;
        (this_02->alloc1).parent = this_02;
        (this_02->alloc1).ptr = (char *)0x0;
        (this_02->alloc1).cur = 0;
        (this_02->alloc1).end = 0;
        (this_02->alloc1).allocBlockSize = 0;
        (this_02->alloc1).end = 0;
        (this_02->alloc1).allocBlockSize = 0;
        (this_02->alloc1).bytesUsed = 0;
        (this_02->alloc1).bytesWasted = 0;
        *local_d0 = (long)this_02;
        local_138 = &FastAllocator::s_thread_local_allocators_lock;
        uStack_130 = 1;
        auVar34 = (undefined1  [16])0x0;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        local_108._M_head_impl = this_02;
        std::
        vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
        ::
        emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                  ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                    *)FastAllocator::s_thread_local_allocators,
                   (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                    *)&local_108);
        if (local_108._M_head_impl != (ThreadLocal2 *)0x0) {
          std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                    ((default_delete<embree::FastAllocator::ThreadLocal2> *)&local_108,
                     local_108._M_head_impl);
        }
        MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      }
      this_00 = &pBVar13->alloc;
      uVar26 = (ulong)(((pBVar13->alloc).use_single_mode ^ 1) << 6);
      local_178._0_8_ = 0xb0;
      this_01 = *(ThreadLocal2 **)((long)&(this_02->alloc0).parent + uVar26);
      if (this_00 != (this_01->alloc)._M_b._M_p) {
        cStack_100 = '\x01';
        local_108._M_head_impl = this_01;
        MutexSys::lock(&this_01->mutex);
        if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
          LOCK();
          paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
          UNLOCK();
          LOCK();
          paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (((this_01->alloc0).end + (this_01->alloc1).end) -
               ((this_01->alloc0).cur + (this_01->alloc1).cur));
          UNLOCK();
          LOCK();
          paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
          UNLOCK();
        }
        (this_01->alloc0).end = 0;
        (this_01->alloc0).allocBlockSize = 0;
        (this_01->alloc0).bytesUsed = 0;
        (this_01->alloc0).bytesWasted = 0;
        (this_01->alloc0).ptr = (char *)0x0;
        (this_01->alloc0).cur = 0;
        (this_01->alloc0).end = 0;
        (this_01->alloc0).allocBlockSize = 0;
        (this_01->alloc0).allocBlockSize = (pBVar13->alloc).defaultBlockSize;
        (this_01->alloc1).ptr = (char *)0x0;
        (this_01->alloc1).cur = 0;
        (this_01->alloc1).end = 0;
        (this_01->alloc1).allocBlockSize = 0;
        (this_01->alloc1).end = 0;
        (this_01->alloc1).allocBlockSize = 0;
        (this_01->alloc1).bytesUsed = 0;
        (this_01->alloc1).bytesWasted = 0;
        (this_01->alloc1).allocBlockSize = (pBVar13->alloc).defaultBlockSize;
        LOCK();
        (this_01->alloc)._M_b._M_p = this_00;
        UNLOCK();
        local_138 = &FastAllocator::s_thread_local_allocators_lock;
        uStack_130 = 1;
        auVar34 = (undefined1  [16])0x0;
        local_c8._M_head_impl = this_01;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        __position._M_current =
             (pBVar13->alloc).thread_local_allocators.
             super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pBVar13->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
          ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                    ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                      *)&(pBVar13->alloc).thread_local_allocators,__position,&local_c8._M_head_impl)
          ;
        }
        else {
          *__position._M_current = local_c8._M_head_impl;
          pppTVar2 = &(pBVar13->alloc).thread_local_allocators.
                      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar2 = *pppTVar2 + 1;
        }
        MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        if (cStack_100 == '\x01') {
          MutexSys::unlock(&(local_108._M_head_impl)->mutex);
        }
      }
      plVar5 = (long *)((long)&(this_02->alloc0).bytesUsed + uVar26);
      *plVar5 = *plVar5 + local_178._0_8_;
      lVar27 = *(long *)((long)&(this_02->alloc0).cur + uVar26);
      uVar28 = (ulong)(-(int)lVar27 & 0xf);
      uVar24 = lVar27 + local_178._0_8_ + uVar28;
      *(ulong *)((long)&(this_02->alloc0).cur + uVar26) = uVar24;
      if (*(ulong *)((long)&(this_02->alloc0).end + uVar26) < uVar24) {
        *(long *)((long)&(this_02->alloc0).cur + uVar26) = lVar27;
        puVar18 = *(undefined8 **)((long)&(this_02->alloc0).allocBlockSize + uVar26);
        if (puVar18 < (undefined8 *)(local_178._0_8_ << 2)) {
          pauVar25 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)local_178);
        }
        else {
          local_138 = puVar18;
          pauVar25 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&local_138);
          *(undefined1 (**) [16])((long)&(this_02->alloc0).ptr + uVar26) = pauVar25;
          lVar27 = (*(long *)((long)&(this_02->alloc0).end + uVar26) -
                   *(long *)((long)&(this_02->alloc0).cur + uVar26)) +
                   *(long *)((long)&(this_02->alloc0).bytesWasted + uVar26);
          *(long *)((long)&(this_02->alloc0).bytesWasted + uVar26) = lVar27;
          *(undefined8 *)((long)&(this_02->alloc0).cur + uVar26) = 0;
          *(undefined8 **)((long)&(this_02->alloc0).end + uVar26) = local_138;
          *(undefined8 *)((long)&(this_02->alloc0).cur + uVar26) = local_178._0_8_;
          if (local_138 < (ulong)local_178._0_8_) {
            *(undefined8 *)((long)&(this_02->alloc0).cur + uVar26) = 0;
            local_138 = *(undefined8 **)((long)&(this_02->alloc0).allocBlockSize + uVar26);
            pauVar25 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&local_138);
            *(undefined1 (**) [16])((long)&(this_02->alloc0).ptr + uVar26) = pauVar25;
            lVar27 = (*(long *)((long)&(this_02->alloc0).end + uVar26) -
                     *(long *)((long)&(this_02->alloc0).cur + uVar26)) +
                     *(long *)((long)&(this_02->alloc0).bytesWasted + uVar26);
            *(long *)((long)&(this_02->alloc0).bytesWasted + uVar26) = lVar27;
            *(undefined8 *)((long)&(this_02->alloc0).cur + uVar26) = 0;
            *(undefined8 **)((long)&(this_02->alloc0).end + uVar26) = local_138;
            *(undefined8 *)((long)&(this_02->alloc0).cur + uVar26) = local_178._0_8_;
            if (local_138 < (ulong)local_178._0_8_) {
              *(undefined8 *)((long)&(this_02->alloc0).cur + uVar26) = 0;
              pauVar25 = (undefined1 (*) [16])0x0;
              goto LAB_013f9b24;
            }
          }
          *(long *)((long)&(this_02->alloc0).bytesWasted + uVar26) = lVar27;
        }
      }
      else {
        plVar5 = (long *)((long)&(this_02->alloc0).bytesWasted + uVar26);
        *plVar5 = *plVar5 + uVar28;
        pauVar25 = (undefined1 (*) [16])
                   ((uVar24 - local_178._0_8_) + *(long *)((long)&(this_02->alloc0).ptr + uVar26));
      }
LAB_013f9b24:
      uVar26 = local_40 - local_48;
      local_178 = vpcmpeqd_avx(auVar34,auVar34);
      uStack_118 = 0;
      uStack_110 = 0;
      local_138 = (undefined8 *)0x0;
      uStack_130 = 0;
      uStack_12f = 0;
      uStack_128 = 0;
      uStack_120 = 0;
      uStack_e8 = 0;
      uStack_e0 = 0;
      local_108._M_head_impl = (ThreadLocal2 *)0x0;
      cStack_100 = '\0';
      uStack_ff = 0;
      uStack_f8 = 0;
      uStack_f0 = 0;
      uStack_a8 = 0;
      uStack_a0 = 0;
      local_c8._M_head_impl = (ThreadLocal2 *)0x0;
      uStack_c0 = 0;
      uStack_b8 = 0;
      uStack_b0 = 0;
      auVar34 = ZEXT816(0) << 0x40;
      local_98 = local_178;
      if (uVar32 < uVar26) {
        pRVar14 = (topBuilder->bvh->scene->geometries).items;
        pfVar29 = local_140[uVar32].upper.field_0.m128 + 3;
        uVar24 = 0;
        do {
          fVar9 = pfVar29[-4];
          fVar10 = *pfVar29;
          pGVar12 = pRVar14[(uint)fVar9].ptr;
          lVar30 = (ulong)(uint)fVar10 *
                   pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar27 = *(long *)&pGVar12->field_0x58;
          lVar15 = *(long *)&pGVar12[1].time_range.upper;
          p_Var16 = pGVar12[1].intersectionFilterN;
          puVar4 = (undefined4 *)(lVar15 + (ulong)*(uint *)(lVar27 + lVar30) * (long)p_Var16);
          uVar11 = puVar4[1];
          uVar22 = puVar4[2];
          auVar34 = *(undefined1 (*) [16])
                     (lVar15 + (ulong)*(uint *)(lVar27 + 4 + lVar30) * (long)p_Var16);
          auVar7 = *(undefined1 (*) [16])
                    (lVar15 + (ulong)*(uint *)(lVar27 + 8 + lVar30) * (long)p_Var16);
          *(undefined4 *)((long)&local_138 + uVar24 * 4) = *puVar4;
          *(undefined4 *)((long)&uStack_128 + uVar24 * 4) = uVar11;
          *(undefined4 *)((long)&uStack_118 + uVar24 * 4) = uVar22;
          *(int *)((long)&local_108._M_head_impl + uVar24 * 4) = auVar34._0_4_;
          uVar11 = vextractps_avx(auVar34,1);
          *(undefined4 *)((long)&uStack_f8 + uVar24 * 4) = uVar11;
          uVar11 = vextractps_avx(auVar34,2);
          *(undefined4 *)((long)&uStack_e8 + uVar24 * 4) = uVar11;
          *(int *)((long)&local_c8._M_head_impl + uVar24 * 4) = auVar7._0_4_;
          uVar11 = vextractps_avx(auVar7,1);
          *(undefined4 *)((long)&uStack_b8 + uVar24 * 4) = uVar11;
          uVar11 = vextractps_avx(auVar7,2);
          *(undefined4 *)((long)&uStack_a8 + uVar24 * 4) = uVar11;
          *(float *)(local_178 + uVar24 * 4) = fVar9;
          *(float *)(local_98 + uVar24 * 4) = fVar10;
          uVar28 = uVar24 + 1;
          if (2 < uVar24) break;
          lVar27 = uVar24 + uVar32;
          pfVar29 = pfVar29 + 8;
          uVar24 = uVar28;
        } while (lVar27 + 1U < uVar26);
        auVar37[8] = uStack_130;
        auVar37._0_8_ = local_138;
        auVar37._9_7_ = uStack_12f;
        auVar36._8_8_ = uStack_120;
        auVar36._0_8_ = uStack_128;
        auVar35._8_8_ = uStack_110;
        auVar35._0_8_ = uStack_118;
        auVar42[8] = cStack_100;
        auVar42._0_8_ = local_108._M_head_impl;
        auVar42._9_7_ = uStack_ff;
        auVar41._8_8_ = uStack_f0;
        auVar41._0_8_ = uStack_f8;
        auVar40._8_8_ = uStack_e0;
        auVar40._0_8_ = uStack_e8;
        auVar39._8_8_ = uStack_c0;
        auVar39._0_8_ = local_c8._M_head_impl;
        auVar38._8_8_ = uStack_b0;
        auVar38._0_8_ = uStack_b8;
        auVar34._8_8_ = uStack_a0;
        auVar34._0_8_ = uStack_a8;
        uVar32 = uVar32 + uVar28;
        auVar7 = local_178;
      }
      else {
        auVar7 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
        auVar38 = ZEXT816(0) << 0x40;
        auVar39 = ZEXT816(0) << 0x40;
        auVar40 = ZEXT816(0) << 0x40;
        auVar41 = ZEXT816(0) << 0x40;
        auVar42 = ZEXT816(0) << 0x40;
        auVar35 = ZEXT816(0) << 0x40;
        auVar36 = ZEXT816(0) << 0x40;
        auVar37 = ZEXT816(0) << 0x40;
      }
      auVar42 = vsubps_avx(auVar37,auVar42);
      auVar41 = vsubps_avx(auVar36,auVar41);
      auVar40 = vsubps_avx(auVar35,auVar40);
      auVar39 = vsubps_avx(auVar39,auVar37);
      auVar38 = vsubps_avx(auVar38,auVar36);
      auVar21 = vsubps_avx(auVar34,auVar35);
      auVar34 = vmovntps_avx(auVar37);
      *pauVar25 = auVar34;
      auVar34 = vmovntps_avx(auVar36);
      pauVar25[1] = auVar34;
      auVar34 = vmovntps_avx(auVar35);
      pauVar25[2] = auVar34;
      auVar34 = vmovntps_avx(auVar42);
      pauVar25[3] = auVar34;
      auVar34 = vmovntps_avx(auVar41);
      pauVar25[4] = auVar34;
      auVar34 = vmovntps_avx(auVar40);
      pauVar25[5] = auVar34;
      auVar34 = vmovntps_avx(auVar39);
      pauVar25[6] = auVar34;
      auVar34 = vmovntps_avx(auVar38);
      pauVar25[7] = auVar34;
      auVar34 = vmovntps_avx(auVar21);
      pauVar25[8] = auVar34;
      auVar34 = vmovntdq_avx(auVar7);
      pauVar25[9] = auVar34;
      auVar34 = vmovntdq_avx(local_98);
      pauVar25[10] = auVar34;
      aVar19.m128 = (__m128)vinsertps_avx(local_88.m128,ZEXT416((uint)local_d8->objectID_),0x30);
      auVar33 = ZEXT1664((undefined1  [16])aVar19);
      aVar20 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(local_78,ZEXT416(1),0x30);
      LOCK();
      paVar3 = &topBuilder->nextRef;
      iVar6 = (paVar3->super___atomic_base<int>)._M_i;
      (paVar3->super___atomic_base<int>)._M_i = (paVar3->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      pBVar17 = (topBuilder->refs).items;
      pBVar17[iVar6].super_PrimRef.upper.field_0 = aVar20;
      pBVar17[iVar6].super_PrimRef.lower.field_0 = aVar19;
      pBVar17[iVar6].node.ptr = (ulong)pauVar25 | 9;
      pBVar17[iVar6].bounds_area = 0.0;
    } while (uVar32 < (ulong)(local_40 - local_48));
  }
  uVar23 = local_150._8_8_;
  if (local_140 != (PrimRef *)0x0) {
    if ((ulong)(local_150._8_8_ << 5) < 0x1c00000) {
      alignedFree(local_140);
    }
    else {
      os_free(local_140,local_150._8_8_ << 5,local_160[8]);
    }
  }
  if (uVar23 != 0) {
    (***(_func_int ***)local_160._0_8_)(local_160._0_8_,uVar23 * -0x20,1);
  }
  return;
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder) {

          Mesh* mesh = topBuilder->scene->template getSafe<Mesh>(objectID_);
          size_t meshSize = mesh->size();
          assert(isSmallGeometry(mesh));
          
          mvector<PrimRef> prefs(topBuilder->scene->device, meshSize);
          auto pinfo = createPrimRefArray(mesh,objectID_,meshSize,prefs,topBuilder->bvh->scene->progressInterface);

          size_t begin=0;
          while (begin < pinfo.size())
          {
            Primitive* accel = (Primitive*) topBuilder->bvh->alloc.getCachedAllocator().malloc1(sizeof(Primitive),BVH::byteAlignment);
            typename BVH::NodeRef node = BVH::encodeLeaf((char*)accel,1);
            accel->fill(prefs.data(),begin,pinfo.size(),topBuilder->bvh->scene);
            
            /* create build primitive */
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node,(unsigned int)objectID_,1);
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node);
#endif
          }
          assert(begin == pinfo.size());
        }